

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.hpp
# Opt level: O0

void __thiscall thread_pool::ThreadPool::ThreadPool(ThreadPool *this,uint32_t num_threads)

{
  uint *puVar1;
  reference this_00;
  size_type sVar2;
  pair<std::thread::id,_unsigned_long> pVar3;
  unsigned_long local_50;
  id local_48;
  pair<std::thread::id,_unsigned_long> local_40;
  ThreadPool *local_30;
  uint local_28 [5];
  uint32_t local_14;
  ThreadPool *pTStack_10;
  uint32_t num_threads_local;
  ThreadPool *this_local;
  
  (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_14 = num_threads;
  pTStack_10 = this;
  std::vector<std::thread,_std::allocator<std::thread>_>::vector(&this->threads_);
  *(undefined8 *)&(this->thread_ids_)._M_h._M_rehash_policy = 0;
  (this->thread_ids_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->thread_ids_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->thread_ids_)._M_h._M_element_count = 0;
  (this->thread_ids_)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->thread_ids_)._M_h._M_bucket_count = 0;
  (this->thread_ids_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  unordered_map<std::thread::id,_unsigned_int,_std::hash<std::thread::id>,_std::equal_to<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_unsigned_int>_>_>
  ::unordered_map(&this->thread_ids_);
  Semaphore::Semaphore(&this->thread_semaphore_,0);
  std::
  queue<std::function<void()>,std::deque<std::function<void()>,std::allocator<std::function<void()>>>>
  ::queue<std::deque<std::function<void()>,std::allocator<std::function<void()>>>,void>
            ((queue<std::function<void()>,std::deque<std::function<void()>,std::allocator<std::function<void()>>>>
              *)&this->queue_);
  Semaphore::Semaphore(&this->queue_semaphore_,1);
  std::atomic<bool>::atomic(&this->terminate_,false);
  local_28[0] = 1;
  puVar1 = std::max<unsigned_int>(local_28,&local_14);
  local_14 = *puVar1;
  while (local_14 != 0) {
    local_30 = this;
    local_14 = local_14 - 1;
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<void(&)(thread_pool::ThreadPool*),thread_pool::ThreadPool*>
              ((vector<std::thread,std::allocator<std::thread>> *)this,Task,&local_30);
    this_00 = std::vector<std::thread,_std::allocator<std::thread>_>::back(&this->threads_);
    local_48 = std::thread::get_id(this_00);
    sVar2 = std::vector<std::thread,_std::allocator<std::thread>_>::size(&this->threads_);
    local_50 = sVar2 - 1;
    pVar3 = std::make_pair<std::thread::id,unsigned_long>(&local_48,&local_50);
    local_40 = pVar3;
    std::
    unordered_map<std::thread::id,unsigned_int,std::hash<std::thread::id>,std::equal_to<std::thread::id>,std::allocator<std::pair<std::thread::id_const,unsigned_int>>>
    ::emplace<std::pair<std::thread::id,unsigned_long>>
              ((unordered_map<std::thread::id,unsigned_int,std::hash<std::thread::id>,std::equal_to<std::thread::id>,std::allocator<std::pair<std::thread::id_const,unsigned_int>>>
                *)&this->thread_ids_,&local_40);
  }
  return;
}

Assistant:

ThreadPool(std::uint32_t num_threads = std::thread::hardware_concurrency() / 2)  // NOLINT
      : threads_(),
        thread_ids_(),
        thread_semaphore_(0),
        queue_(),
        queue_semaphore_(1),
        terminate_(false) {
    num_threads = std::max(1U, num_threads);
    while (num_threads-- != 0) {
      threads_.emplace_back(ThreadPool::Task, this);
      thread_ids_.emplace(std::make_pair(threads_.back().get_id(), threads_.size() - 1));
    }
  }